

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_sse41.c
# Opt level: O2

void blake3_compress_xof_sse41
               (uint32_t *cv,uint8_t *block,uint8_t block_len,uint64_t counter,uint8_t flags,
               uint8_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined3 in_register_00000011;
  undefined3 in_register_00000081;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  auVar17 = *(undefined1 (*) [16])block;
  auVar14 = *(undefined1 (*) [16])(block + 0x10);
  auVar6 = vpaddd_avx(*(undefined1 (*) [16])(cv + 4),*(undefined1 (*) [16])cv);
  auVar1 = vpinsrb_avx(ZEXT416(CONCAT31(in_register_00000011,block_len)),
                       CONCAT31(in_register_00000081,flags),4);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = counter;
  auVar16 = vpunpcklqdq_avx(auVar18,auVar1);
  auVar1 = *(undefined1 (*) [16])(block + 0x20);
  auVar18 = *(undefined1 (*) [16])(block + 0x30);
  auVar15 = vshufps_avx(auVar17,auVar14,0x88);
  auVar6 = vpaddd_avx(auVar6,auVar15);
  auVar2 = vshufps_avx(auVar1,auVar18,0x88);
  auVar8 = vshufps_avx(auVar1,auVar18,0x7d);
  auVar3 = vprold_avx512vl(auVar6 ^ auVar16,0x10);
  auVar16 = vpaddd_avx(auVar3,_DAT_0019ba90);
  auVar9 = vshufps_avx(auVar8,auVar8,0xd2);
  auVar4 = vprold_avx512vl(auVar16 ^ *(undefined1 (*) [16])(cv + 4),0x14);
  auVar11 = vshufps_avx(auVar17,auVar14,0xdd);
  auVar14 = vblendps_avx(auVar17,auVar14,2);
  auVar6 = vpaddd_avx(auVar6,auVar11);
  auVar12 = vshufps_avx(auVar15,auVar11,0xd6);
  auVar6 = vpaddd_avx(auVar4,auVar6);
  auVar13 = vpaddd_avx(auVar2,auVar6);
  auVar3 = vprold_avx512vl(auVar3 ^ auVar6,0x18);
  auVar13 = vpshufd_avx(auVar13,0x93);
  auVar6 = vpaddd_avx(auVar16,auVar3);
  auVar3 = vpshufd_avx(auVar3,0x4e);
  auVar5 = vpshufd_avx(auVar6,0x39);
  auVar4 = vprold_avx512vl(auVar6 ^ auVar4,0x19);
  auVar6 = vpaddd_avx(auVar4,auVar13);
  auVar16 = vpaddd_avx(auVar9,auVar6);
  auVar3 = vprold_avx512vl(auVar6 ^ auVar3,0x10);
  auVar6 = vpaddd_avx(auVar5,auVar3);
  auVar5 = vprold_avx512vl(auVar6 ^ auVar4,0x14);
  auVar16 = vpaddd_avx(auVar5,auVar16);
  auVar13 = vpaddd_avx(auVar12,auVar16);
  auVar3 = vprold_avx512vl(auVar3 ^ auVar16,0x18);
  auVar16 = vpshufd_avx(auVar13,0x39);
  auVar6 = vpaddd_avx(auVar6,auVar3);
  auVar13 = vpshufd_avx(auVar3,0x4e);
  auVar3 = vpshufd_avx(auVar6,0x93);
  auVar6 = vprold_avx512vl(auVar6 ^ auVar5,0x19);
  auVar16 = vpaddd_avx(auVar6,auVar16);
  auVar4 = vprold_avx512vl(auVar16 ^ auVar13,0x10);
  auVar13 = vpaddd_avx(auVar3,auVar4);
  auVar7 = vprold_avx512vl(auVar13 ^ auVar6,0x14);
  auVar6 = vinsertps_avx(auVar8,auVar1,0x95);
  auVar8 = vpermi2ps_avx512vl(_DAT_0019bbb0,auVar15,auVar6);
  auVar16 = vpaddd_avx(auVar8,auVar16);
  auVar3 = vpaddd_avx(auVar7,auVar16);
  auVar16 = vmovlhps_avx(auVar9,auVar11);
  auVar5 = vpshufd_avx(auVar3,0x93);
  auVar15 = vunpckhps_avx(auVar11,auVar9);
  auVar3 = vprold_avx512vl(auVar4 ^ auVar3,0x18);
  auVar9 = vpermi2ps_avx512vl(_DAT_0019bbc0,auVar16,auVar18);
  auVar16 = vpaddd_avx(auVar13,auVar3);
  auVar3 = vpshufd_avx(auVar3,0x4e);
  auVar13 = vpaddd_avx(auVar9,auVar5);
  auVar5 = vpshufd_avx(auVar16,0x39);
  auVar4 = vprold_avx512vl(auVar16 ^ auVar7,0x19);
  auVar16 = vpaddd_avx(auVar4,auVar13);
  auVar7 = vprold_avx512vl(auVar16 ^ auVar3,0x10);
  auVar13 = vpaddd_avx(auVar5,auVar7);
  auVar4 = vprold_avx512vl(auVar13 ^ auVar4,0x14);
  auVar10 = vpermi2ps_avx512vl(_DAT_0019bbd0,auVar2,auVar15);
  auVar15 = vshufps_avx(auVar11,auVar6,0xd7);
  auVar3 = vpaddd_avx(auVar16,auVar10);
  auVar16 = vmovlhps_avx(auVar10,auVar8);
  auVar9 = vunpcklps_avx(auVar9,auVar14);
  auVar2 = vshufps_avx(auVar6,auVar18,0x87);
  auVar14 = vpaddd_avx(auVar3,auVar4);
  auVar8 = vshufps_avx(auVar9,auVar9,0x1e);
  auVar6 = vpaddd_avx(auVar14,auVar15);
  auVar5 = vshufps_avx(auVar12,auVar12,0x18);
  auVar3 = vprold_avx512vl(auVar14 ^ auVar7,0x18);
  auVar6 = vpshufd_avx(auVar6,0x39);
  auVar14 = vpaddd_avx(auVar13,auVar3);
  auVar13 = vpshufd_avx(auVar3,0x4e);
  auVar3 = vpshufd_avx(auVar14,0x93);
  auVar11 = vprold_avx512vl(auVar14 ^ auVar4,0x19);
  auVar6 = vpaddd_avx(auVar11,auVar6);
  auVar12 = vpermi2ps_avx512vl(_DAT_0019bbe0,auVar5,auVar18);
  auVar14 = vmovlhps_avx(auVar8,auVar5);
  auVar5 = vprold_avx512vl(auVar6 ^ auVar13,0x10);
  auVar13 = vpaddd_avx(auVar3,auVar5);
  auVar6 = vpaddd_avx(auVar12,auVar6);
  auVar11 = vprold_avx512vl(auVar13 ^ auVar11,0x14);
  auVar6 = vpaddd_avx(auVar11,auVar6);
  auVar3 = vpshufd_avx(auVar6,0x93);
  auVar5 = vprold_avx512vl(auVar5 ^ auVar6,0x18);
  auVar6 = vpaddd_avx(auVar13,auVar5);
  auVar13 = vpshufd_avx(auVar5,0x4e);
  auVar5 = vpshufd_avx(auVar6,0x39);
  auVar11 = vprold_avx512vl(auVar6 ^ auVar11,0x19);
  auVar12 = vpermt2ps_avx512vl(auVar16,_DAT_0019bbf0,auVar1);
  auVar4 = vpermt2d_avx512vl(auVar14,_DAT_0019bbf0,auVar10);
  auVar14 = vpaddd_avx(auVar3,auVar12);
  auVar14 = vpaddd_avx(auVar14,auVar11);
  auVar6 = vpaddd_avx(auVar14,auVar8);
  auVar13 = vprold_avx512vl(auVar14 ^ auVar13,0x10);
  auVar14 = vpaddd_avx(auVar5,auVar13);
  auVar5 = vprold_avx512vl(auVar14 ^ auVar11,0x14);
  auVar6 = vpaddd_avx(auVar6,auVar5);
  auVar16 = vpaddd_avx(auVar6,auVar2);
  auVar13 = vprold_avx512vl(auVar6 ^ auVar13,0x18);
  auVar6 = vpshufd_avx(auVar16,0x39);
  auVar14 = vpaddd_avx(auVar14,auVar13);
  auVar13 = vpshufd_avx(auVar13,0x4e);
  auVar3 = vpshufd_avx(auVar14,0x93);
  auVar14 = vprold_avx512vl(auVar14 ^ auVar5,0x19);
  auVar16 = vpaddd_avx(auVar14,auVar6);
  auVar5 = vshufps_avx(auVar15,auVar15,0x18);
  auVar13 = vprold_avx512vl(auVar16 ^ auVar13,0x10);
  auVar3 = vpaddd_avx512vl(auVar3,auVar13);
  auVar15 = vprold_avx512vl(auVar3 ^ auVar14,0x14);
  auVar6 = vinsertps_avx(auVar8,auVar1,0x55);
  auVar14 = vblendps_avx(auVar5,auVar6,10);
  auVar14 = vpaddd_avx(auVar16,auVar14);
  auVar14 = vpaddd_avx(auVar14,auVar15);
  auVar16 = vpxorq_avx512vl(auVar13,auVar14);
  auVar14 = vpshufd_avx(auVar14,0x93);
  auVar13 = vprold_avx512vl(auVar16,0x18);
  auVar14 = vpaddd_avx(auVar14,auVar4);
  auVar16 = vpaddd_avx(auVar3,auVar13);
  auVar13 = vpshufd_avx(auVar13,0x4e);
  auVar3 = vpshufd_avx(auVar16,0x39);
  auVar15 = vprold_avx512vl(auVar16 ^ auVar15,0x19);
  auVar16 = vpaddd_avx(auVar15,auVar14);
  auVar11 = vprold_avx512vl(auVar16 ^ auVar13,0x10);
  auVar13 = vpaddd_avx(auVar3,auVar11);
  auVar7 = vprold_avx512vl(auVar13 ^ auVar15,0x14);
  auVar14 = vinsertps_avx(auVar9,auVar17,0x8c);
  auVar14 = vunpcklps_avx(auVar12,auVar14);
  auVar15 = vshufps_avx(auVar14,auVar14,0x1e);
  auVar14 = vpaddd_avx(auVar16,auVar15);
  auVar16 = vmovlhps_avx512f(auVar15,auVar5);
  auVar14 = vpaddd_avx(auVar14,auVar7);
  auVar9 = vpermt2d_avx512vl(auVar16,_DAT_0019bbf0,auVar8);
  auVar8 = vshufps_avx(auVar18,auVar6,0xd2);
  auVar3 = vprold_avx512vl(auVar11 ^ auVar14,0x18);
  auVar14 = vpaddd_avx(auVar14,auVar8);
  auVar16 = vpshufd_avx(auVar14,0x39);
  auVar14 = vpaddd_avx(auVar13,auVar3);
  auVar3 = vpshufd_avx(auVar3,0x4e);
  auVar5 = vpshufd_avx(auVar14,0x93);
  auVar14 = vprold_avx512vl(auVar14 ^ auVar7,0x19);
  auVar13 = vpaddd_avx(auVar14,auVar16);
  auVar11 = vprold_avx512vl(auVar13 ^ auVar3,0x10);
  auVar3 = vpaddd_avx(auVar5,auVar11);
  auVar16 = vinsertps_avx(auVar15,auVar4,0x95);
  auVar12 = vprold_avx512vl(auVar3 ^ auVar14,0x14);
  auVar5 = vshufps_avx(auVar2,auVar2,0x18);
  auVar14 = vblendps_avx(auVar5,auVar16,10);
  auVar2 = vshufps_avx(auVar6,auVar16,0xd7);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar6 = vpaddd_avx512vl(auVar14,auVar12);
  auVar14 = vpshufd_avx(auVar6,0x93);
  auVar6 = vprold_avx512vl(auVar11 ^ auVar6,0x18);
  auVar13 = vpaddd_avx512vl(auVar14,auVar9);
  auVar14 = vpaddd_avx(auVar3,auVar6);
  auVar6 = vpshufd_avx(auVar6,0x4e);
  auVar3 = vpxord_avx512vl(auVar14,auVar12);
  auVar16 = vpshufd_avx(auVar14,0x39);
  auVar3 = vprold_avx512vl(auVar3,0x19);
  auVar14 = vpaddd_avx(auVar3,auVar13);
  auVar13 = vprold_avx512vl(auVar6 ^ auVar14,0x10);
  auVar6 = vpaddd_avx(auVar16,auVar13);
  auVar11 = vprold_avx512vl(auVar6 ^ auVar3,0x14);
  auVar12 = vpermi2ps_avx512vl(_DAT_0019bc00,auVar4,auVar17);
  auVar16 = vpaddd_avx(auVar14,auVar12);
  auVar14 = vmovlhps_avx(auVar12,auVar5);
  auVar16 = vpaddd_avx(auVar11,auVar16);
  auVar15 = vpermt2d_avx512vl(auVar14,_DAT_0019bbf0,auVar15);
  auVar14 = vpaddd_avx(auVar2,auVar16);
  auVar5 = vinsertps_avx512f(auVar12,auVar9,0x95);
  auVar13 = vprold_avx512vl(auVar13 ^ auVar16,0x18);
  auVar16 = vpshufd_avx(auVar14,0x39);
  auVar14 = vpaddd_avx(auVar6,auVar13);
  auVar13 = vpshufd_avx(auVar13,0x4e);
  auVar3 = vpshufd_avx(auVar14,0x93);
  auVar14 = vprold_avx512vl(auVar14 ^ auVar11,0x19);
  auVar6 = vpaddd_avx(auVar14,auVar16);
  auVar13 = vprold_avx512vl(auVar6 ^ auVar13,0x10);
  auVar16 = vpaddd_avx(auVar3,auVar13);
  auVar11 = vprold_avx512vl(auVar16 ^ auVar14,0x14);
  auVar3 = vshufps_avx(auVar8,auVar8,0x18);
  auVar14 = vblendps_avx(auVar3,auVar5,10);
  auVar14 = vpaddd_avx(auVar6,auVar14);
  auVar14 = vpaddd_avx(auVar14,auVar11);
  auVar6 = vpshufd_avx(auVar14,0x93);
  auVar13 = vprold_avx512vl(auVar13 ^ auVar14,0x18);
  auVar14 = vpaddd_avx(auVar6,auVar15);
  auVar8._8_8_ = 0x700000002;
  auVar8._0_8_ = 0x700000002;
  auVar6 = vpaddd_avx(auVar16,auVar13);
  auVar16 = vpshufd_avx(auVar13,0x4e);
  auVar13 = vpshufd_avx(auVar6,0x39);
  auVar6 = vprold_avx512vl(auVar6 ^ auVar11,0x19);
  auVar5 = vpermi2ps_avx512vl(_DAT_0019bc10,auVar1,auVar5);
  auVar14 = vpaddd_avx(auVar6,auVar14);
  auVar17 = vpermi2ps_avx512vl(auVar8,auVar1,auVar17);
  auVar16 = vprold_avx512vl(auVar16 ^ auVar14,0x10);
  auVar1 = vpaddd_avx(auVar13,auVar16);
  auVar17 = vunpcklps_avx512vl(auVar9,auVar17);
  auVar13 = vshufps_avx(auVar17,auVar17,0x1e);
  auVar8 = vprold_avx512vl(auVar1 ^ auVar6,0x14);
  auVar17 = vblendps_avx(auVar18,auVar17,2);
  auVar6 = vpmovsxbd_avx(ZEXT416(0x40501));
  auVar18 = vpaddd_avx(auVar13,auVar14);
  auVar14 = vmovlhps_avx(auVar13,auVar3);
  auVar18 = vpaddd_avx(auVar8,auVar18);
  auVar3 = vpermt2d_avx512vl(auVar14,_DAT_0019bbf0,auVar12);
  auVar14 = vpshufd_avx(auVar18,0x39);
  auVar18 = vprold_avx512vl(auVar16 ^ auVar18,0x18);
  auVar14 = vpaddd_avx(auVar5,auVar14);
  auVar1 = vpaddd_avx(auVar1,auVar18);
  auVar18 = vpshufd_avx(auVar18,0x4e);
  auVar16 = vpshufd_avx(auVar1,0x93);
  auVar5 = vprold_avx512vl(auVar1 ^ auVar8,0x19);
  auVar6 = vpermi2d_avx512vl(auVar6,auVar15,auVar17);
  auVar14 = vpaddd_avx(auVar5,auVar14);
  auVar18 = vprold_avx512vl(auVar18 ^ auVar14,0x10);
  auVar1 = vpaddd_avx(auVar16,auVar18);
  auVar17 = vinsertps_avx(auVar13,auVar15,0x95);
  auVar17 = vpermi2ps_avx512vl(_DAT_0019bc20,auVar2,auVar17);
  auVar16 = vprold_avx512vl(auVar5 ^ auVar1,0x14);
  auVar17 = vpaddd_avx(auVar17,auVar14);
  auVar17 = vpaddd_avx(auVar16,auVar17);
  auVar14 = vpshufd_avx(auVar17,0x93);
  auVar18 = vprold_avx512vl(auVar18 ^ auVar17,0x18);
  auVar17 = vpaddd_avx(auVar14,auVar3);
  auVar14 = vpaddd_avx(auVar1,auVar18);
  auVar1 = vpshufd_avx(auVar18,0x4e);
  auVar18 = vpshufd_avx(auVar14,0x39);
  auVar16 = vprold_avx512vl(auVar16 ^ auVar14,0x19);
  auVar17 = vpaddd_avx(auVar16,auVar17);
  auVar14 = vpaddd_avx(auVar17,auVar6);
  auVar6 = vprold_avx512vl(auVar17 ^ auVar1,0x10);
  auVar17 = vpaddd_avx(auVar18,auVar6);
  auVar16 = vprold_avx512vl(auVar16 ^ auVar17,0x14);
  auVar14 = vpaddd_avx(auVar14,auVar16);
  auVar1 = vpshufd_avx(auVar14,0x39);
  auVar14 = vprold_avx512vl(auVar6 ^ auVar14,0x18);
  auVar17 = vpaddd_avx(auVar17,auVar14);
  auVar14 = vpshufd_avx(auVar14,0x4e);
  auVar18 = vpshufd_avx(auVar17,0x93);
  auVar17 = vprold_avx512vl(auVar17 ^ auVar16,0x19);
  *(undefined1 (*) [16])out = auVar18 ^ auVar1;
  *(undefined1 (*) [16])(out + 0x10) = auVar17 ^ auVar14;
  *(undefined1 (*) [16])(out + 0x20) = auVar18 ^ *(undefined1 (*) [16])cv;
  *(undefined1 (*) [16])(out + 0x30) = auVar14 ^ *(undefined1 (*) [16])(cv + 4);
  return;
}

Assistant:

INLINE __m128i loadu(const uint8_t src[16]) {
  return _mm_loadu_si128((const __m128i *)src);
}